

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O3

void __thiscall helics::BaseTimeCoordinator::BaseTimeCoordinator(BaseTimeCoordinator *this)

{
  this->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__BaseTimeCoordinator_004cc5b0;
  (this->dependencies).dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dependencies).dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dependencies).dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dependencies).mDelayedDependency.gid = -2010000000;
  *(undefined8 *)&(this->sendMessageFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendMessageFunction).super__Function_base._M_functor + 8) = 0;
  (this->sendMessageFunction)._M_invoker =
       std::
       _Function_handler<void_(const_helics::ActionMessage_&),_helics::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BaseTimeCoordinator.cpp:24:35)>
       ::_M_invoke;
  (this->sendMessageFunction).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_helics::ActionMessage_&),_helics::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BaseTimeCoordinator.cpp:24:35)>
       ::_M_manager;
  this->mSourceId = 0;
  this->sequenceCounter = 0;
  this->noParent = true;
  this->federatesOnly = false;
  this->checkingExec = false;
  this->executionMode = false;
  this->restrictive_time_policy = false;
  this->restrictive_time_policy = false;
  this->nonGranting = false;
  this->delayedTiming = false;
  this->disconnected = false;
  return;
}

Assistant:

BaseTimeCoordinator::BaseTimeCoordinator(): sendMessageFunction(nullMessageFunction) {}